

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundImpDirWrapper.cpp
# Opt level: O3

char * __thiscall BoundEntryWrapper::getLibraryName(BoundEntryWrapper *this)

{
  Executable *pEVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  DataDirEntryWrapper *this_00;
  offset_t oVar4;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  iVar2 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
            _vptr_AbstractByteBuffer[0x23])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    this_00 = (DataDirEntryWrapper *)
              __dynamic_cast(CONCAT44(extraout_var,iVar2),&ExeNodeWrapper::typeinfo,
                             &BoundImpDirWrapper::typeinfo,0);
    if (this_00 != (DataDirEntryWrapper *)0x0) {
      oVar4 = DataDirEntryWrapper::getDirEntryAddress(this_00);
      pEVar1 = (this_00->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.m_Exe;
      iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                        (pEVar1,oVar4,2,8,0);
      if (CONCAT44(extraout_var_00,iVar2) != 0) {
        iVar2 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
                  _vptr_AbstractByteBuffer[6])(this,CONCAT44(extraout_var_00,iVar2),0);
        if (CONCAT44(extraout_var_01,iVar2) != -1) {
          iVar3 = (*(this->super_ExeNodeWrapper).super_ExeElementWrapper.super_AbstractByteBuffer.
                    _vptr_AbstractByteBuffer[0xc])(this);
          if (CONCAT44(extraout_var_02,iVar3) != 0) {
            pEVar1 = (this->super_ExeNodeWrapper).super_ExeElementWrapper.m_Exe;
            iVar2 = (*(pEVar1->super_AbstractByteBuffer)._vptr_AbstractByteBuffer[0xe])
                              (pEVar1,CONCAT44(extraout_var_01,iVar2) +
                                      (ulong)*(ushort *)(CONCAT44(extraout_var_02,iVar3) + 4),1,1,0)
            ;
            return (char *)CONCAT44(extraout_var_03,iVar2);
          }
        }
      }
    }
  }
  return (char *)0x0;
}

Assistant:

char* BoundEntryWrapper::getLibraryName()
{
    //----
    BoundImpDirWrapper* parent = dynamic_cast<BoundImpDirWrapper*> (this->getParentNode());
    if (!parent) return NULL;

    IMAGE_BOUND_IMPORT_DESCRIPTOR* firstEntry = parent->boundImp();
    if (firstEntry == NULL) return NULL;

    uint64_t offset = this->getOffset(firstEntry);
    if (offset == INVALID_ADDR) return NULL;
    //----
    IMAGE_BOUND_IMPORT_DESCRIPTOR* bImp = (IMAGE_BOUND_IMPORT_DESCRIPTOR*) this->getPtr();
    if (bImp == NULL) return NULL;

    WORD mnOff = bImp->OffsetModuleName;

    offset += mnOff;

    char *ptr = (char*) m_Exe->getContentAt(offset, Executable::RAW, 1);
    return ptr;
}